

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O1

pair<unsigned_long,_chaiscript::Boxed_Value> * __thiscall
chaiscript::detail::Dispatch_Engine::get_function_object_int
          (pair<unsigned_long,_chaiscript::Boxed_Value> *__return_storage_ptr__,
          Dispatch_Engine *this,string_view t_name,size_t t_hint)

{
  pointer ppVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>
  _Var4;
  range_error *this_00;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_70._M_str = t_name._M_str;
  local_70._M_len = t_name._M_len;
  _Var4 = utility::QuickFlatMap<std::__cxx11::string,chaiscript::Boxed_Value,chaiscript::str_equal>
          ::find<std::basic_string_view<char,std::char_traits<char>>>
                    ((QuickFlatMap<std::__cxx11::string,chaiscript::Boxed_Value,chaiscript::str_equal>
                      *)&(this->m_state).m_boxed_functions,&local_70,t_hint);
  if (_Var4._M_current !=
      (this->m_state).m_boxed_functions.data.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar1 = (this->m_state).m_boxed_functions.data.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = ((_Var4._M_current)->second).m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var3 = ((_Var4._M_current)->second).m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    __return_storage_ptr__->first =
         ((long)_Var4._M_current - (long)ppVar1 >> 4) * -0x5555555555555555;
    (__return_storage_ptr__->second).m_data.
    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    (__return_storage_ptr__->second).m_data.
    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = p_Var3;
    return __return_storage_ptr__;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,local_70._M_str,local_70._M_str + local_70._M_len);
  std::operator+(&local_40,"Object not found: ",&local_60);
  std::range_error::range_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

std::pair<size_t, Boxed_Value> get_function_object_int(std::string_view t_name, const size_t t_hint) const {
        const auto &funs = get_boxed_functions_int();

        if (const auto itr = funs.find(t_name, t_hint); itr != funs.end()) {
          return std::make_pair(std::distance(funs.begin(), itr), itr->second);
        } else {
          throw std::range_error("Object not found: " + std::string(t_name));
        }
      }